

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execAndiccr<(moira::Instr)11,(moira::Mode)11,(moira::Size)1>(Moira *this,u16 opcode)

{
  u8 uVar1;
  u32 uVar2;
  undefined2 in_SI;
  Moira *in_RDI;
  u32 result;
  u8 dst;
  u32 src;
  u32 in_stack_ffffffffffffffdc;
  u32 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  u32 op1;
  undefined2 in_stack_fffffffffffffff4;
  
  uVar2 = readI<(moira::Size)1>(in_RDI);
  uVar1 = getCCR((Moira *)0x25677e);
  op1 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffec);
  (*in_RDI->_vptr_Moira[0x19])(in_RDI,8);
  uVar2 = logic<(moira::Instr)11,(moira::Size)1>
                    ((Moira *)CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,uVar2)),op1,
                     in_stack_ffffffffffffffe8);
  setCCR(in_RDI,(u8)uVar2);
  readM<(moira::MemSpace)1,(moira::Size)2,0ul>(in_RDI,in_stack_ffffffffffffffdc);
  prefetch<4ul>(in_RDI);
  return;
}

Assistant:

void
Moira::execAndiccr(u16 opcode)
{
    u32 src = readI<S>();
    u8  dst = getCCR();

    sync(8);

    u32 result = logic<I,S>(src, dst);
    setCCR(result);

    (void)readM<MEM_DATA, Word>(reg.pc+2);
    prefetch<POLLIPL>();
}